

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# agate.cpp
# Opt level: O3

Am_Point_List compute_arrowhead(Am_Point_List *pl)

{
  char cVar1;
  int iVar2;
  Am_Add_Position AVar3;
  Am_Point_List *pAVar4;
  Am_Point_Item *extraout_RDX;
  Am_Point_Item *extraout_RDX_00;
  Am_Point_Item *pAVar5;
  int *in_RSI;
  Am_Point_List AVar6;
  int y1;
  int x1;
  int y2;
  int x2;
  int local_5c;
  int local_58;
  int local_54;
  int local_50;
  float local_4c;
  float local_48;
  float local_44;
  float local_40;
  float local_3c;
  float local_38;
  float local_34;
  Am_Point_List local_30;
  
  Am_Point_List::Start();
  cVar1 = Am_Point_List::Last();
  if (cVar1 == '\0') {
    Am_Point_List::Get(in_RSI,&local_58);
    while( true ) {
      Am_Point_List::Next();
      cVar1 = Am_Point_List::Last();
      if (cVar1 != '\0') break;
      Am_Point_List::Get(in_RSI,&local_50);
      if ((local_58 != local_50) || (local_5c != local_54)) goto LAB_001053ea;
    }
    local_50 = local_58 + 1;
    local_54 = local_5c;
LAB_001053ea:
    local_54 = local_54 - local_5c;
    iVar2 = local_50 - local_58;
    local_3c = (float)iVar2;
    local_44 = 5.0 / SQRT((float)(local_54 * local_54 + iVar2 * iVar2));
    local_4c = (float)local_54 * 0.5;
    local_48 = local_3c * -0.8660254;
    local_34 = (local_48 - local_4c) * local_44;
    local_40 = (float)local_54 * -0.8660254;
    local_38 = (local_3c * 0.5 + local_40) * local_44;
    Am_Point_List::Am_Point_List(&local_30);
    AVar3 = Am_Point_List::Add((float)((int)local_34 + local_58),(float)((int)local_38 + local_5c),
                               (Am_Add_Position)&local_30,true);
    AVar3 = Am_Point_List::Add((float)local_58,(float)local_5c,AVar3,true);
    pAVar4 = (Am_Point_List *)
             Am_Point_List::Add((float)((int)((local_48 + local_4c) * local_44) + local_58),
                                (float)((int)((local_3c * -0.5 + local_40) * local_44) + local_5c),
                                AVar3,true);
    Am_Point_List::Am_Point_List(pl,pAVar4);
    Am_Point_List::~Am_Point_List(&local_30);
    pAVar5 = extraout_RDX_00;
  }
  else {
    pl->data = (Am_Point_List_Data *)0x0;
    pAVar5 = extraout_RDX;
  }
  AVar6.item = pAVar5;
  AVar6.data = (Am_Point_List_Data *)pl;
  return AVar6;
}

Assistant:

Am_Point_List
compute_arrowhead(Am_Point_List pl)
{
  int x1, y1, x2, y2;

  // get the first two distinct points out of pl into (x1,y1) and (x2,y2)
  pl.Start();
  if (pl.Last())
    return nullptr;
  pl.Get(x1, y1);

  do {
    pl.Next();
    if (pl.Last()) {
      x2 = x1 + 1;
      y2 = y1;
    } else
      pl.Get(x2, y2);

  } while (x1 == x2 && y1 == y2);

  // compute a 60 degree angle with vertex at x1,y1, pointing toward x2,y2
  int dx = x2 - x1;
  int dy = y2 - y1;
  float d = sqrt((double)(dx * dx + dy * dy));
  float scale = ARROWHEAD_LENGTH / d;

  const float a = 0.8660254037844; // cos(30 deg)
  const float b = 0.5;             // sin(30 deg)

  float dxa = (-a * dx - b * dy) * scale;
  float dya = (b * dx - a * dy) * scale;
  float dxb = (-a * dx + b * dy) * scale;
  float dyb = (-b * dx - a * dy) * scale;

  return Am_Point_List()
      .Add(x1 + (int)dxa, y1 + (int)dya)
      .Add(x1, y1)
      .Add(x1 + (int)dxb, y1 + (int)dyb);
}